

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O1

void __thiscall nn::ESoinn::deleteNodes(ESoinn *this)

{
  int iVar1;
  AbstractWeightVector *pAVar2;
  long lVar3;
  uint32_t *puVar4;
  ConcreteLogger *this_00;
  pointer pEVar5;
  ulong uVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  double dVar10;
  double local_68;
  double local_60;
  string local_58;
  uint local_2c;
  
  this_00 = log_netw;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"deleteNodes function","");
  logger::ConcreteLogger::debug(this_00,&local_58,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_2c = 0;
  pEVar5 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  _Var8._M_p = local_58._M_dataplus._M_p;
  puVar4 = (uint32_t *)local_58._M_string_length;
  if ((this->m_Neurons).
      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar5) {
    uVar7 = 0;
    do {
      if (pEVar5[uVar7].m_IsDeleted == false) {
        if ((int)pEVar5[uVar7].m_Neighbours._M_h._M_element_count == 0) {
          pAVar2 = pEVar5[uVar7].super_AbstractNeuron.m_wv;
          if (pAVar2 != (AbstractWeightVector *)0x0) {
            (*pAVar2->_vptr_AbstractWeightVector[7])();
          }
          (this->m_Neurons).
          super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
          super__Vector_impl_data._M_start[local_2c].m_IsDeleted = true;
        }
        uVar7 = (ulong)local_2c;
        pEVar5 = (this->m_Neurons).
                 super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar1 = (int)pEVar5[uVar7].m_Neighbours._M_h._M_element_count;
        if (iVar1 == 2) {
          local_68 = pEVar5[uVar7].m_Density;
          local_60 = this->m_C2;
          dVar10 = calcAvgDensity(this);
        }
        else {
          if (iVar1 != 1) goto LAB_0013135a;
          local_68 = pEVar5[uVar7].m_Density;
          local_60 = this->m_C1;
          dVar10 = calcAvgDensity(this);
        }
        if (local_68 < local_60 * dVar10) {
          if (local_58._M_string_length == local_58.field_2._M_allocated_capacity) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                       (iterator)local_58._M_string_length,&local_2c);
          }
          else {
            *(uint *)local_58._M_string_length = local_2c;
            local_58._M_string_length = local_58._M_string_length + 4;
          }
        }
      }
LAB_0013135a:
      local_2c = local_2c + 1;
      uVar7 = (ulong)local_2c;
      pEVar5 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar5 >> 3) *
              -0xf0f0f0f0f0f0f0f;
      _Var8._M_p = local_58._M_dataplus._M_p;
      puVar4 = (uint32_t *)local_58._M_string_length;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
  }
  for (; (uint32_t *)_Var8._M_p != puVar4; _Var8._M_p = (pointer)((long)_Var8._M_p + 4)) {
    deleteNeuron(this,*(uint32_t *)_Var8._M_p);
  }
  pEVar5 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_Neurons).
      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar5) {
    uVar7 = 0;
    uVar6 = 1;
    do {
      if ((pEVar5[uVar7].m_IsDeleted == false) &&
         ((int)pEVar5[uVar7].m_Neighbours._M_h._M_element_count == 0)) {
        pAVar2 = pEVar5[uVar7].super_AbstractNeuron.m_wv;
        if (pAVar2 != (AbstractWeightVector *)0x0) {
          (*pAVar2->_vptr_AbstractWeightVector[7])();
        }
        (this->m_Neurons).
        super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7].m_IsDeleted = true;
      }
      pEVar5 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar5 >> 3) *
              -0xf0f0f0f0f0f0f0f;
      bVar9 = uVar6 <= uVar7;
      lVar3 = uVar7 - uVar6;
      uVar7 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar9 && lVar3 != 0);
  }
  if ((uint32_t *)local_58._M_dataplus._M_p != (uint32_t *)0x0) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ESoinn::deleteNodes()
    {
        log_netw->debug("deleteNodes function");
        //list of neurons which we will delete
        std::vector<uint32_t> deleted_neurons;
        //double avg_density = calcAvgDensity();
        
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            if (m_Neurons[i].getNumNeighbours() == 0)
            {
                delete m_Neurons[i].getWv();   
                m_Neurons[i].setDeleted();
            }
            
            if (m_Neurons[i].getNumNeighbours() == 1)
            {
                if (m_Neurons[i].density() < m_C1 * calcAvgDensity())
                    deleted_neurons.push_back(i);
            }
            else if (m_Neurons[i].getNumNeighbours() == 2)
            {
                if (m_Neurons[i].density() < m_C2 * calcAvgDensity())
                    deleted_neurons.push_back(i);
            }            
        }
        //delete neurons from list
        for (uint32_t num: deleted_neurons)
            deleteNeuron(num);    

        //delete neurons without neighbours (it may appeared after deletion other neurons)
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            if (m_Neurons[i].getNumNeighbours() == 0)
            {
                delete m_Neurons[i].getWv();   
                m_Neurons[i].setDeleted();
            }
        }
    }